

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall Importer_getNonexistentModel_Test::TestBody(Importer_getNonexistentModel_Test *this)

{
  char *pcVar1;
  allocator<char> local_71;
  shared_ptr<libcellml::Model> local_70;
  AssertionResult gtest_ar;
  string local_50 [32];
  ImporterPtr importer;
  void *local_20;
  ModelPtr model;
  
  libcellml::Importer::create(SUB81(&importer,0));
  std::__cxx11::string::string<std::allocator<char>>(local_50,"model",(allocator<char> *)&gtest_ar);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"howdy",(allocator<char> *)&gtest_ar);
  libcellml::Importer::addModel
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&model);
  std::__cxx11::string::~string(local_50);
  local_20 = (void *)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"bonjour",&local_71);
  libcellml::Importer::library((string *)&local_70);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            ((internal *)&gtest_ar,"nullptr","importer->library(\"bonjour\")",&local_20,&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string(local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1ac,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Importer, getNonexistentModel)
{
    auto importer = libcellml::Importer::create();
    auto model = libcellml::Model::create("model");
    importer->addModel(model, "howdy");
    EXPECT_EQ(nullptr, importer->library("bonjour"));
}